

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O0

int decomp(uchar *srcBuf,uchar **jpegBuf,unsigned_long *jpegSize,uchar *dstBuf,int w,int h,
          int subsamp,int jpegQual,char *fileName,int tilew,int tileh)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  int *piVar13;
  size_t __size;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  char *pcVar19;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  double dVar20;
  double dVar21;
  double dVar22;
  int in_stack_00000008;
  uint in_stack_00000010;
  undefined8 in_stack_00000018;
  uint in_stack_00000020;
  uint in_stack_00000028;
  int y;
  unsigned_long bindex;
  unsigned_long gindex;
  unsigned_long rindex;
  unsigned_long index2;
  unsigned_long index;
  char *_tjErrorStr_5;
  int _tjErrorCode_5;
  char *_tjErrorStr_4;
  int _tjErrorCode_4;
  char *_tjErrorStr_3;
  int _tjErrorCode_3;
  char *_tjErrorStr_2;
  int _tjErrorCode_2;
  double startDecode;
  int height_1;
  int width_1;
  double start;
  int tile;
  char *_tjErrorStr_1;
  int _tjErrorCode_1;
  unsigned_long yuvSize;
  int height;
  int width;
  char *_tjErrorStr;
  int _tjErrorCode;
  uchar *yuvBuf;
  uchar *dstPtr2;
  uchar *dstPtr;
  int ntilesh;
  int ntilesw;
  int pitch;
  int scaledh;
  int scaledw;
  int ps;
  double elapsedDecode;
  double elapsed;
  int retval;
  int dstBufAlloc;
  int iter;
  int col;
  int row;
  tjhandle handle;
  FILE *file;
  char *ptr;
  char qualStr [13];
  char sizeStr [24];
  char tempStr [1024];
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  uint local_5a0;
  uint local_59c;
  int local_594;
  undefined8 in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  long lVar23;
  undefined8 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  int local_50c;
  void *local_4d8;
  void *local_4d0;
  void *local_4c8;
  double local_4a8;
  double local_4a0;
  int local_494;
  int local_48c;
  int local_488;
  int local_484;
  long local_480;
  char local_465 [12];
  undefined1 local_459;
  char local_458 [32];
  char local_438 [1032];
  uint local_30;
  uint local_2c;
  void *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_458,0,0x18);
  memset(local_465,0,0xd);
  bVar2 = false;
  local_494 = 0;
  iVar11 = tjPixelSize[pf];
  uVar4 = (int)(local_2c * sf.num + sf.denom + -1) / sf.denom;
  uVar5 = (int)(local_30 * sf.num + sf.denom + -1) / sf.denom;
  iVar6 = uVar4 * iVar11;
  iVar7 = local_2c + in_stack_00000020;
  iVar8 = (int)(local_30 + in_stack_00000028 + -1) / (int)in_stack_00000028;
  local_4d8 = (void *)0x0;
  if (0 < (int)in_stack_00000010) {
    snprintf(local_465,0xd,"_Q%d",(ulong)in_stack_00000010);
    local_459 = 0;
  }
  local_480 = tjInitDecompress();
  if (local_480 == 0) {
    iVar9 = tjGetErrorCode(0);
    pcVar12 = (char *)tjGetErrorStr2(0);
    if (((flags & 0x2000U) != 0) || (iVar9 != 0)) {
      pcVar19 = "ERROR";
      if (iVar9 == 0) {
        pcVar19 = "WARNING";
      }
      printf("%s in line %d while %s:\n%s\n",pcVar19,0xa2,"executing tjInitDecompress()",pcVar12);
      local_494 = -1;
      goto LAB_00108937;
    }
    iVar10 = strncmp(tjErrorStr,pcVar12,200);
    if ((((iVar10 != 0) ||
         (iVar10 = strncmp(tjErrorMsg,"executing tjInitDecompress()",200), iVar10 != 0)) ||
        (tjErrorCode != 0)) || (tjErrorLine != 0xa2)) {
      strncpy(tjErrorStr,pcVar12,199);
      strncpy(tjErrorMsg,"executing tjInitDecompress()",199);
      tjErrorLine = 0xa2;
      tjErrorCode = iVar9;
      printf("WARNING in line %d while %s:\n%s\n",0xa2,"executing tjInitDecompress()",pcVar12);
    }
  }
  if (local_28 == (void *)0x0) {
    local_28 = malloc((long)iVar6 * (long)(int)uVar5);
    if (local_28 == (void *)0x0) {
      piVar13 = __errno_location();
      pcVar12 = strerror(*piVar13);
      printf("ERROR in line %d while %s:\n%s\n",0xa9,"allocating destination buffer",pcVar12);
      local_494 = -1;
      goto LAB_00108937;
    }
    bVar2 = true;
  }
  memset(local_28,0x7f,(long)iVar6 * (long)(int)uVar5);
  if (doYUV != 0) {
    local_59c = uVar5;
    uVar1 = uVar4;
    if (doTile != 0) {
      local_59c = in_stack_00000028;
      uVar1 = in_stack_00000020;
    }
    __size = tjBufSizeYUV2(uVar1,yuvPad,local_59c,in_stack_00000008);
    if (__size == 0xffffffffffffffff) {
      iVar9 = tjGetErrorCode(local_480);
      pcVar12 = (char *)tjGetErrorStr2(local_480);
      if (((flags & 0x2000U) != 0) || (iVar9 != 0)) {
        pcVar19 = "ERROR";
        if (iVar9 == 0) {
          pcVar19 = "WARNING";
        }
        printf("%s in line %d while %s:\n%s\n",pcVar19,0xb6,"allocating YUV buffer",pcVar12);
        local_494 = -1;
        goto LAB_00108937;
      }
      iVar10 = strncmp(tjErrorStr,pcVar12,200);
      if (((iVar10 != 0) || (iVar10 = strncmp(tjErrorMsg,"allocating YUV buffer",200), iVar10 != 0))
         || ((tjErrorCode != 0 || (tjErrorLine != 0xb6)))) {
        strncpy(tjErrorStr,pcVar12,199);
        strncpy(tjErrorMsg,"allocating YUV buffer",199);
        tjErrorLine = 0xb6;
        tjErrorCode = iVar9;
        printf("WARNING in line %d while %s:\n%s\n",0xb6,"allocating YUV buffer",pcVar12);
      }
    }
    local_4d8 = malloc(__size);
    if (local_4d8 == (void *)0x0) {
      piVar13 = __errno_location();
      pcVar12 = strerror(*piVar13);
      printf("ERROR in line %d while %s:\n%s\n",0xb8,"allocating YUV buffer",pcVar12);
      local_494 = -1;
      goto LAB_00108937;
    }
    memset(local_4d8,0x7f,__size);
  }
  local_48c = -1;
  local_4a8 = 0.0;
  local_4a0 = 0.0;
  do {
    while( true ) {
      local_50c = 0;
      dVar20 = getTime();
      local_4c8 = local_28;
      for (local_484 = 0; local_484 < iVar8; local_484 = local_484 + 1) {
        local_4d0 = local_4c8;
        for (local_488 = 0; local_488 < (iVar7 + -1) / (int)in_stack_00000020;
            local_488 = local_488 + 1) {
          local_5a4 = uVar4;
          if (doTile != 0) {
            if ((int)in_stack_00000020 < (int)(local_2c - local_488 * in_stack_00000020)) {
              local_5a0 = in_stack_00000020;
            }
            else {
              local_5a0 = local_2c - local_488 * in_stack_00000020;
            }
            local_5a4 = local_5a0;
          }
          local_5ac = uVar5;
          if (doTile != 0) {
            if ((int)in_stack_00000028 < (int)(local_30 - local_484 * in_stack_00000028)) {
              local_5a8 = in_stack_00000028;
            }
            else {
              local_5a8 = local_30 - local_484 * in_stack_00000028;
            }
            local_5ac = local_5a8;
          }
          if (doYUV == 0) {
            iVar9 = tjDecompress2(local_480,*(undefined8 *)(local_18 + (long)local_50c * 8),
                                  *(undefined8 *)(local_20 + (long)local_50c * 8),local_4d0,
                                  local_5a4,iVar6,local_5ac,pf,flags);
            if (iVar9 == -1) {
              iVar9 = tjGetErrorCode(local_480);
              pcVar12 = (char *)tjGetErrorStr2(local_480);
              if (((flags & 0x2000U) != 0) || (iVar9 != 0)) {
                pcVar19 = "ERROR";
                if (iVar9 == 0) {
                  pcVar19 = "WARNING";
                }
                printf("%s in line %d while %s:\n%s\n",pcVar19,0xd8,"executing tjDecompress2()",
                       pcVar12);
                local_494 = -1;
                goto LAB_00108937;
              }
              iVar10 = strncmp(tjErrorStr,pcVar12,200);
              if ((((iVar10 != 0) ||
                   (iVar10 = strncmp(tjErrorMsg,"executing tjDecompress2()",200), iVar10 != 0)) ||
                  (tjErrorCode != 0)) || (tjErrorLine != 0xd8)) {
                strncpy(tjErrorStr,pcVar12,199);
                strncpy(tjErrorMsg,"executing tjDecompress2()",199);
                tjErrorLine = 0xd8;
                tjErrorCode = iVar9;
                printf("WARNING in line %d while %s:\n%s\n",0xd8,"executing tjDecompress2()",pcVar12
                      );
              }
            }
          }
          else {
            iVar9 = tjDecompressToYUV2(local_480,*(undefined8 *)(local_18 + (long)local_50c * 8),
                                       *(undefined8 *)(local_20 + (long)local_50c * 8),local_4d8,
                                       local_5a4,yuvPad,local_5ac,flags);
            if (iVar9 == -1) {
              iVar9 = tjGetErrorCode(local_480);
              pcVar12 = (char *)tjGetErrorStr2(local_480);
              if (((flags & 0x2000U) != 0) || (iVar9 != 0)) {
                pcVar19 = "ERROR";
                if (iVar9 == 0) {
                  pcVar19 = "WARNING";
                }
                printf("%s in line %d while %s:\n%s\n",pcVar19,0xcf,"executing tjDecompressToYUV2()"
                       ,pcVar12);
                local_494 = -1;
                goto LAB_00108937;
              }
              iVar10 = strncmp(tjErrorStr,pcVar12,200);
              if (((iVar10 != 0) ||
                  (iVar10 = strncmp(tjErrorMsg,"executing tjDecompressToYUV2()",200), iVar10 != 0))
                 || ((tjErrorCode != 0 || (tjErrorLine != 0xcf)))) {
                strncpy(tjErrorStr,pcVar12,199);
                strncpy(tjErrorMsg,"executing tjDecompressToYUV2()",199);
                tjErrorLine = 0xcf;
                tjErrorCode = iVar9;
                printf("WARNING in line %d while %s:\n%s\n",0xcf,"executing tjDecompressToYUV2()",
                       pcVar12);
              }
            }
            dVar21 = getTime();
            iVar9 = tjDecodeYUV(local_480,local_4d8,yuvPad,in_stack_00000008,local_4d0,local_5a4,
                                iVar6,local_5ac,pf,flags);
            if (iVar9 == -1) {
              iVar9 = tjGetErrorCode(local_480);
              pcVar12 = (char *)tjGetErrorStr2(local_480);
              if (((flags & 0x2000U) != 0) || (iVar9 != 0)) {
                pcVar19 = "ERROR";
                if (iVar9 == 0) {
                  pcVar19 = "WARNING";
                }
                printf("%s in line %d while %s:\n%s\n",pcVar19,0xd3,"executing tjDecodeYUV()",
                       pcVar12);
                local_494 = -1;
                goto LAB_00108937;
              }
              iVar10 = strncmp(tjErrorStr,pcVar12,200);
              if ((((iVar10 != 0) ||
                   (iVar10 = strncmp(tjErrorMsg,"executing tjDecodeYUV()",200), iVar10 != 0)) ||
                  (tjErrorCode != 0)) || (tjErrorLine != 0xd3)) {
                strncpy(tjErrorStr,pcVar12,199);
                strncpy(tjErrorMsg,"executing tjDecodeYUV()",199);
                tjErrorLine = 0xd3;
                tjErrorCode = iVar9;
                printf("WARNING in line %d while %s:\n%s\n",0xd3,"executing tjDecodeYUV()",pcVar12);
              }
            }
            if (-1 < local_48c) {
              dVar22 = getTime();
              local_4a8 = (dVar22 - dVar21) + local_4a8;
            }
          }
          local_50c = local_50c + 1;
          local_4d0 = (void *)((long)local_4d0 + (long)(int)(iVar11 * in_stack_00000020));
        }
        local_4c8 = (void *)((long)iVar6 * (long)(int)in_stack_00000028 + (long)local_4c8);
      }
      dVar21 = getTime();
      iVar9 = (int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
      iVar10 = (int)((ulong)in_stack_fffffffffffffa98 >> 0x20);
      local_4a0 = (dVar21 - dVar20) + local_4a0;
      if (-1 < local_48c) break;
      if (warmup <= local_4a0) {
        local_48c = 0;
        local_4a8 = 0.0;
        local_4a0 = 0.0;
      }
    }
    local_48c = local_48c + 1;
  } while (local_4a0 < benchTime);
  if (doYUV != 0) {
    local_4a0 = local_4a0 - local_4a8;
  }
  iVar7 = tjDestroy(local_480);
  if (iVar7 == -1) {
    in_stack_fffffffffffffaa4 = tjGetErrorCode(local_480);
    pcVar12 = (char *)tjGetErrorStr2(local_480);
    if (((flags & 0x2000U) != 0) || (in_stack_fffffffffffffaa4 != 0)) {
      pcVar19 = "ERROR";
      if (in_stack_fffffffffffffaa4 == 0) {
        pcVar19 = "WARNING";
      }
      printf("%s in line %d while %s:\n%s\n",pcVar19,0xe6,"executing tjDestroy()",pcVar12);
      local_494 = -1;
      goto LAB_00108937;
    }
    iVar7 = strncmp(tjErrorStr,pcVar12,200);
    if (((iVar7 != 0) || (iVar7 = strncmp(tjErrorMsg,"executing tjDestroy()",200), iVar7 != 0)) ||
       ((tjErrorCode != in_stack_fffffffffffffaa4 || (tjErrorLine != 0xe6)))) {
      strncpy(tjErrorStr,pcVar12,199);
      strncpy(tjErrorMsg,"executing tjDestroy()",199);
      tjErrorCode = in_stack_fffffffffffffaa4;
      tjErrorLine = 0xe6;
      in_stack_fffffffffffffaa4 = tjErrorCode;
      printf("WARNING in line %d while %s:\n%s\n",0xe6,"executing tjDestroy()",pcVar12);
    }
    iVar10 = (int)((ulong)pcVar12 >> 0x20);
  }
  local_480 = 0;
  if (quiet == 0) {
    pcVar12 = "Decompress   ";
    if (doYUV != 0) {
      pcVar12 = "Decomp to YUV";
    }
    printf("%s --> Frame rate:         %f fps\n",(double)local_48c / local_4a0,pcVar12);
    printf("                  Throughput:         %f Megapixels/sec\n",
           (((double)(int)(local_2c * local_30) / 1000000.0) * (double)local_48c) / local_4a0);
    if (doYUV != 0) {
      printf("YUV Decode    --> Frame rate:         %f fps\n",(double)local_48c / local_4a8);
      printf("                  Throughput:         %f Megapixels/sec\n",
             (((double)(int)(local_2c * local_30) / 1000000.0) * (double)local_48c) / local_4a8);
    }
  }
  else {
    pcVar12 = sigfig((double)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),iVar10,
                     in_stack_fffffffffffffa90,iVar9);
    pcVar19 = "  ";
    if (quiet == 2) {
      pcVar19 = "\n";
    }
    printf("%-6s%s",pcVar12,pcVar19);
    if (doYUV == 0) {
      if (quiet != 2) {
        printf("\n");
      }
    }
    else {
      pcVar12 = sigfig((double)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),iVar10,
                       in_stack_fffffffffffffa90,iVar9);
      printf("%s\n",pcVar12);
    }
  }
  if (doWrite != 0) {
    if ((sf.num == 1) && (sf.denom == 1)) {
      if ((in_stack_00000020 == local_2c) && (in_stack_00000028 == local_30)) {
        snprintf(local_458,0x18,"full");
      }
      else {
        snprintf(local_458,0x18,"%dx%d",(ulong)in_stack_00000020,(ulong)in_stack_00000028);
      }
    }
    else {
      snprintf(local_458,0x18,"%d_%d",(ulong)(uint)sf.num,(ulong)(uint)sf.denom);
    }
    if (decompOnly == 0) {
      snprintf(local_438,0x400,"%s_%s%s_%s.%s",in_stack_00000018,subName[in_stack_00000008],
               local_465,local_458,ext);
    }
    else {
      snprintf(local_438,0x400,"%s_%s.%s",in_stack_00000018,local_458,ext);
    }
    iVar7 = tjSaveImage(local_438,local_28,uVar4,0,uVar5,pf,flags);
    if (iVar7 == -1) {
      uVar14 = tjGetErrorStr2(0);
      printf("ERROR in line %d while %s:\n%s\n",0x10e,"saving bitmap",uVar14);
      local_494 = -1;
    }
    else {
      pcVar12 = strrchr(local_438,0x2e);
      snprintf(pcVar12,0x400 - ((long)pcVar12 - (long)local_438),"-err.%s",ext);
      if (((local_10 != 0) && (sf.num == 1)) && (sf.denom == 1)) {
        if (quiet == 0) {
          printf("Compression error written to %s.\n",local_438);
        }
        if (in_stack_00000008 == 3) {
          lVar23 = 0;
          for (local_484 = 0; local_484 < (int)local_30; local_484 = local_484 + 1) {
            lVar18 = lVar23;
            for (local_488 = 0; local_488 < (int)local_2c; local_488 = local_488 + 1) {
              lVar15 = lVar18 + tjRedOffset[pf];
              lVar16 = lVar18 + tjGreenOffset[pf];
              lVar17 = lVar18 + tjBlueOffset[pf];
              local_594 = (int)((double)*(byte *)(local_10 + lVar17) * 0.114 +
                                (double)*(byte *)(local_10 + lVar15) * 0.299 +
                                (double)*(byte *)(local_10 + lVar16) * 0.587 + 0.5);
              if (0xff < local_594) {
                local_594 = 0xff;
              }
              if (local_594 < 0) {
                local_594 = 0;
              }
              iVar7 = (uint)*(byte *)((long)local_28 + lVar15) - local_594;
              cVar3 = (char)iVar7;
              if (iVar7 < 1) {
                cVar3 = -cVar3;
              }
              *(char *)((long)local_28 + lVar15) = cVar3;
              iVar7 = (uint)*(byte *)((long)local_28 + lVar16) - local_594;
              cVar3 = (char)iVar7;
              if (iVar7 < 1) {
                cVar3 = -cVar3;
              }
              *(char *)((long)local_28 + lVar16) = cVar3;
              local_594 = (uint)*(byte *)((long)local_28 + lVar17) - local_594;
              cVar3 = (char)local_594;
              if (local_594 < 1) {
                cVar3 = -cVar3;
              }
              *(char *)((long)local_28 + lVar17) = cVar3;
              lVar18 = iVar11 + lVar18;
            }
            lVar23 = iVar6 + lVar23;
          }
        }
        else {
          for (local_484 = 0; local_484 < (int)local_30; local_484 = local_484 + 1) {
            for (local_488 = 0; local_488 < (int)(local_2c * iVar11); local_488 = local_488 + 1) {
              iVar7 = (uint)*(byte *)((long)local_28 + (long)(iVar6 * local_484 + local_488)) -
                      (uint)*(byte *)(local_10 + (iVar6 * local_484 + local_488));
              cVar3 = (char)iVar7;
              if (iVar7 < 1) {
                cVar3 = -cVar3;
              }
              *(char *)((long)local_28 + (long)(iVar6 * local_484 + local_488)) = cVar3;
            }
          }
        }
        iVar11 = tjSaveImage(local_438,local_28,local_2c,0,local_30,pf,flags);
        if (iVar11 == -1) {
          uVar14 = tjGetErrorStr2(0);
          printf("ERROR in line %d while %s:\n%s\n",0x12d,"saving bitmap",uVar14);
          local_494 = -1;
        }
      }
    }
  }
LAB_00108937:
  if (local_480 != 0) {
    tjDestroy(local_480);
  }
  if (bVar2) {
    free(local_28);
  }
  free(local_4d8);
  return local_494;
}

Assistant:

static int decomp(unsigned char *srcBuf, unsigned char **jpegBuf,
                  unsigned long *jpegSize, unsigned char *dstBuf, int w, int h,
                  int subsamp, int jpegQual, char *fileName, int tilew,
                  int tileh)
{
  char tempStr[1024], sizeStr[24] = "\0", qualStr[13] = "\0", *ptr;
  FILE *file = NULL;
  tjhandle handle = NULL;
  int row, col, iter = 0, dstBufAlloc = 0, retval = 0;
  double elapsed, elapsedDecode;
  int ps = tjPixelSize[pf];
  int scaledw = TJSCALED(w, sf);
  int scaledh = TJSCALED(h, sf);
  int pitch = scaledw * ps;
  int ntilesw = (w + tilew - 1) / tilew, ntilesh = (h + tileh - 1) / tileh;
  unsigned char *dstPtr, *dstPtr2, *yuvBuf = NULL;

  if (jpegQual > 0) {
    snprintf(qualStr, 13, "_Q%d", jpegQual);
    qualStr[12] = 0;
  }

  if ((handle = tjInitDecompress()) == NULL)
    THROW_TJ("executing tjInitDecompress()");

  if (dstBuf == NULL) {
    if ((unsigned long long)pitch * (unsigned long long)scaledh >
        (unsigned long long)((size_t)-1))
      THROW("allocating destination buffer", "Image is too large");
    if ((dstBuf = (unsigned char *)malloc((size_t)pitch * scaledh)) == NULL)
      THROW_UNIX("allocating destination buffer");
    dstBufAlloc = 1;
  }
  /* Set the destination buffer to gray so we know whether the decompressor
     attempted to write to it */
  memset(dstBuf, 127, (size_t)pitch * scaledh);

  if (doYUV) {
    int width = doTile ? tilew : scaledw;
    int height = doTile ? tileh : scaledh;
    unsigned long yuvSize = tjBufSizeYUV2(width, yuvPad, height, subsamp);

    if (yuvSize == (unsigned long)-1)
      THROW_TJ("allocating YUV buffer");
    if ((yuvBuf = (unsigned char *)malloc(yuvSize)) == NULL)
      THROW_UNIX("allocating YUV buffer");
    memset(yuvBuf, 127, yuvSize);
  }

  /* Benchmark */
  iter = -1;
  elapsed = elapsedDecode = 0.;
  while (1) {
    int tile = 0;
    double start = getTime();

    for (row = 0, dstPtr = dstBuf; row < ntilesh;
         row++, dstPtr += (size_t)pitch * tileh) {
      for (col = 0, dstPtr2 = dstPtr; col < ntilesw;
           col++, tile++, dstPtr2 += ps * tilew) {
        int width = doTile ? min(tilew, w - col * tilew) : scaledw;
        int height = doTile ? min(tileh, h - row * tileh) : scaledh;

        if (doYUV) {
          double startDecode;

          if (tjDecompressToYUV2(handle, jpegBuf[tile], jpegSize[tile], yuvBuf,
                                 width, yuvPad, height, flags) == -1)
            THROW_TJ("executing tjDecompressToYUV2()");
          startDecode = getTime();
          if (tjDecodeYUV(handle, yuvBuf, yuvPad, subsamp, dstPtr2, width,
                          pitch, height, pf, flags) == -1)
            THROW_TJ("executing tjDecodeYUV()");
          if (iter >= 0) elapsedDecode += getTime() - startDecode;
        } else if (tjDecompress2(handle, jpegBuf[tile], jpegSize[tile],
                                 dstPtr2, width, pitch, height, pf,
                                 flags) == -1)
          THROW_TJ("executing tjDecompress2()");
      }
    }
    elapsed += getTime() - start;
    if (iter >= 0) {
      iter++;
      if (elapsed >= benchTime) break;
    } else if (elapsed >= warmup) {
      iter = 0;
      elapsed = elapsedDecode = 0.;
    }
  }
  if (doYUV) elapsed -= elapsedDecode;

  if (tjDestroy(handle) == -1) THROW_TJ("executing tjDestroy()");
  handle = NULL;

  if (quiet) {
    printf("%-6s%s",
           sigfig((double)(w * h) / 1000000. * (double)iter / elapsed, 4,
                  tempStr, 1024),
           quiet == 2 ? "\n" : "  ");
    if (doYUV)
      printf("%s\n",
             sigfig((double)(w * h) / 1000000. * (double)iter / elapsedDecode,
                    4, tempStr, 1024));
    else if (quiet != 2) printf("\n");
  } else {
    printf("%s --> Frame rate:         %f fps\n",
           doYUV ? "Decomp to YUV" : "Decompress   ", (double)iter / elapsed);
    printf("                  Throughput:         %f Megapixels/sec\n",
           (double)(w * h) / 1000000. * (double)iter / elapsed);
    if (doYUV) {
      printf("YUV Decode    --> Frame rate:         %f fps\n",
             (double)iter / elapsedDecode);
      printf("                  Throughput:         %f Megapixels/sec\n",
             (double)(w * h) / 1000000. * (double)iter / elapsedDecode);
    }
  }

  if (!doWrite) goto bailout;

  if (sf.num != 1 || sf.denom != 1)
    snprintf(sizeStr, 24, "%d_%d", sf.num, sf.denom);
  else if (tilew != w || tileh != h)
    snprintf(sizeStr, 24, "%dx%d", tilew, tileh);
  else snprintf(sizeStr, 24, "full");
  if (decompOnly)
    snprintf(tempStr, 1024, "%s_%s.%s", fileName, sizeStr, ext);
  else
    snprintf(tempStr, 1024, "%s_%s%s_%s.%s", fileName, subName[subsamp],
             qualStr, sizeStr, ext);

  if (tjSaveImage(tempStr, dstBuf, scaledw, 0, scaledh, pf, flags) == -1)
    THROW_TJG("saving bitmap");
  ptr = strrchr(tempStr, '.');
  snprintf(ptr, 1024 - (ptr - tempStr), "-err.%s", ext);
  if (srcBuf && sf.num == 1 && sf.denom == 1) {
    if (!quiet) printf("Compression error written to %s.\n", tempStr);
    if (subsamp == TJ_GRAYSCALE) {
      unsigned long index, index2;

      for (row = 0, index = 0; row < h; row++, index += pitch) {
        for (col = 0, index2 = index; col < w; col++, index2 += ps) {
          unsigned long rindex = index2 + tjRedOffset[pf];
          unsigned long gindex = index2 + tjGreenOffset[pf];
          unsigned long bindex = index2 + tjBlueOffset[pf];
          int y = (int)((double)srcBuf[rindex] * 0.299 +
                        (double)srcBuf[gindex] * 0.587 +
                        (double)srcBuf[bindex] * 0.114 + 0.5);

          if (y > 255) y = 255;
          if (y < 0) y = 0;
          dstBuf[rindex] = abs(dstBuf[rindex] - y);
          dstBuf[gindex] = abs(dstBuf[gindex] - y);
          dstBuf[bindex] = abs(dstBuf[bindex] - y);
        }
      }
    } else {
      for (row = 0; row < h; row++)
        for (col = 0; col < w * ps; col++)
          dstBuf[pitch * row + col] =
            abs(dstBuf[pitch * row + col] - srcBuf[pitch * row + col]);
    }
    if (tjSaveImage(tempStr, dstBuf, w, 0, h, pf, flags) == -1)
      THROW_TJG("saving bitmap");
  }

bailout:
  if (file) fclose(file);
  if (handle) tjDestroy(handle);
  if (dstBufAlloc) free(dstBuf);
  free(yuvBuf);
  return retval;
}